

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGenerator::Logger::HeadLine_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,string_view title)

{
  size_type __n;
  char local_5d [20];
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char local_21;
  undefined1 local_20 [8];
  string_view title_local;
  
  title_local._M_len = title._M_len;
  local_21 = '\n';
  local_20 = (undefined1  [8])this;
  title_local._M_str = (char *)__return_storage_ptr__;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__n,'-',&local_49);
  local_5d[0] = '\n';
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,char,std::__cxx11::string,char>
            (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)local_20,
             &local_21,&local_48,local_5d);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::Logger::HeadLine(cm::string_view title)
{
  return cmStrCat(title, '\n', std::string(title.size(), '-'), '\n');
}